

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O1

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  pointer pBVar1;
  pointer pBVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  bool bVar9;
  undefined1 auVar10 [16];
  int *piVar11;
  pointer pvVar12;
  byte bVar13;
  undefined4 extraout_EAX;
  float *pfVar14;
  ulong uVar15;
  pointer pfVar16;
  uint uVar17;
  BBoxRect *__args;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  float *pfVar22;
  pointer pMVar23;
  float *pfVar24;
  int iVar25;
  long lVar26;
  float *pfVar27;
  long lVar28;
  float fVar29;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar30;
  float fVar32;
  undefined1 in_XMM1 [16];
  undefined1 auVar31 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<int,_std::allocator<int>_> picked;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  int local_1ec;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_1e8;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_1c8;
  YoloDetectionOutput *local_1a8;
  float local_19c;
  vector<float,_std::allocator<float>_> local_198;
  int iStack_180;
  Allocator *local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  ulong local_160;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_158;
  undefined8 local_138;
  undefined8 uStack_130;
  vector<float,_std::allocator<float>_> local_128;
  int local_108;
  uint local_104;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_100;
  Option *local_f8;
  long local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined1 local_b8 [16];
  int local_a8;
  ulong local_a0;
  pointer local_98;
  long local_90;
  ulong local_88;
  float *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pMVar23 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_100 = bottom_top_blobs;
  local_f8 = opt;
  if ((bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish != pMVar23) {
    uVar19 = 0;
    local_1a8 = this;
    do {
      iVar25 = pMVar23[uVar19].c / this->num_box;
      if (iVar25 != this->num_class + 5) {
        iVar25 = -1;
        goto LAB_0016c703;
      }
      local_138 = *(float **)&pMVar23[uVar19].w;
      uStack_130 = 0;
      local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0 = uVar19;
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::resize(&local_1c8,(long)this->num_box);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize(&local_1e8,(long)this->num_box);
      if (0 < this->num_box) {
        pMVar23 = pMVar23 + uVar19;
        auVar31._4_4_ = -(uint)(0 < (int)(float)local_138);
        auVar31._0_4_ = -(uint)(0 < (int)(float)local_138);
        auVar31._8_4_ = -(uint)(0 < local_138._4_4_);
        auVar31._12_4_ = -(uint)(0 < local_138._4_4_);
        local_104 = movmskpd(extraout_EAX,auVar31);
        bVar13 = (byte)local_104;
        auVar10._4_4_ = (float)local_138._4_4_;
        auVar10._0_4_ = (float)(int)(float)local_138;
        auVar10._8_4_ = (float)(int)uStack_130;
        auVar10._12_4_ = (float)uStack_130._4_4_;
        in_XMM1 = rcpps(in_XMM1,auVar10);
        local_78 = in_XMM1._0_4_;
        fStack_74 = in_XMM1._4_4_;
        fStack_70 = in_XMM1._8_4_;
        fStack_6c = in_XMM1._12_4_;
        local_78 = (1.0 - (float)(int)(float)local_138 * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)local_138._4_4_ * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (0.0 - (float)(int)uStack_130 * fStack_70) * fStack_70 + fStack_70;
        fStack_6c = (0.0 - (float)uStack_130._4_4_ * fStack_6c) * fStack_6c + fStack_6c;
        local_90 = (long)iVar25;
        local_88 = (ulong)local_138 & 0xffffffff;
        local_108 = local_138._4_4_;
        lVar28 = 0;
        local_98 = pMVar23;
        do {
          lVar26 = lVar28 * local_90;
          local_e8 = *(undefined8 *)((long)(this->biases).data + lVar28 * 8);
          uStack_e0 = 0;
          sVar7 = pMVar23->cstep;
          local_138 = (float *)pMVar23->data;
          sVar8 = pMVar23->elemsize;
          local_160 = pMVar23->elemsize;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((lVar26 + 5) * pMVar23->cstep * local_160 + (long)pMVar23->data);
          iStack_180 = pMVar23->elempack;
          local_178 = pMVar23->allocator;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = 0;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)local_160;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(local_160 >> 0x20);
          local_170 = CONCAT44(pMVar23->w,3);
          uStack_168 = CONCAT44(this->num_class,pMVar23->h);
          local_160 = ((long)(pMVar23->h * pMVar23->w) * local_160 + 0xf & 0xfffffffffffffff0) /
                      local_160;
          (*this->softmax->_vptr_Layer[9])(this->softmax,&local_198,local_f8);
          local_f0 = lVar28;
          if (bVar13 >> 1 != 0) {
            pfVar14 = (float *)(sVar7 * lVar26 * sVar8 + (long)local_138);
            pfVar24 = (float *)((lVar26 + 1) * sVar7 * sVar8 + (long)local_138);
            pfVar18 = (float *)((lVar26 + 2) * sVar7 * sVar8 + (long)local_138);
            pfVar27 = (float *)((lVar26 + 3) * sVar7 * sVar8 + (long)local_138);
            pfVar22 = (float *)((lVar26 + 4) * sVar7 * sVar8 + (long)local_138);
            local_e8 = CONCAT44(local_e8._4_4_ * 0.5,(float)local_e8 * 0.5);
            uStack_e0 = CONCAT44(uStack_e0._4_4_ * 0.0,(float)uStack_e0 * 0.0);
            local_1ec = 0;
            do {
              if ((local_104 & 1) != 0) {
                local_68 = ZEXT416((uint)(float)local_1ec);
                lVar28 = 0;
                uVar19 = 0;
                do {
                  local_138 = (float *)CONCAT44(local_138._4_4_,*pfVar18);
                  local_c8 = *pfVar27;
                  local_d8 = -*pfVar14;
                  fStack_d4 = -*pfVar24;
                  uStack_d0 = 0x80000000;
                  uStack_cc = 0x80000000;
                  local_80 = pfVar14;
                  local_48 = expf(local_d8);
                  fStack_44 = extraout_XMM0_Db;
                  local_58 = expf(fStack_d4);
                  fStack_54 = extraout_XMM0_Db_00;
                  local_d8 = expf(local_c8);
                  local_c8 = expf((float)local_138);
                  local_138 = pfVar22;
                  fVar29 = expf(-*pfVar22);
                  lVar26 = local_f0;
                  if ((long)local_1a8->num_class < 1) {
                    iVar25 = 0;
                    auVar31 = ZEXT816(0);
                  }
                  else {
                    pfVar14 = (float *)((long)local_1ec * (long)local_170._4_4_ *
                                        CONCAT44(local_198.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                 _4_4_,local_198.
                                                                                                              
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _0_4_) + lVar28 +
                                       (long)local_198.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start);
                    fVar33 = 0.0;
                    uVar20 = 0;
                    uVar15 = 0;
                    do {
                      fVar30 = *pfVar14;
                      bVar9 = fVar33 < fVar30;
                      if (fVar30 <= fVar33) {
                        fVar30 = fVar33;
                      }
                      fVar33 = fVar30;
                      auVar31 = ZEXT416((uint)fVar33);
                      if (bVar9) {
                        uVar15 = uVar20 & 0xffffffff;
                      }
                      iVar25 = (int)uVar15;
                      uVar20 = uVar20 + 1;
                      pfVar14 = (float *)((long)pfVar14 +
                                         CONCAT44(local_198.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _4_4_,local_198.
                                                                                                                
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _0_4_) * local_160);
                    } while ((long)local_1a8->num_class != uVar20);
                  }
                  in_XMM1._4_12_ = auVar31._4_12_;
                  in_XMM1._0_4_ = auVar31._0_4_ / (fVar29 + 1.0);
                  local_19c = in_XMM1._0_4_;
                  if (local_1a8->confidence_threshold <= in_XMM1._0_4_) {
                    auVar36._0_4_ = local_48 + 1.0;
                    auVar36._4_4_ = local_58 + 1.0;
                    auVar36._8_4_ = fStack_44 + 0.0;
                    auVar36._12_4_ = fStack_54 + 0.0;
                    auVar31 = rcpps(in_XMM1,auVar36);
                    fVar29 = auVar31._0_4_;
                    fVar33 = auVar31._4_4_;
                    fVar29 = ((float)(int)uVar19 + fVar29 + (1.0 - auVar36._0_4_ * fVar29) * fVar29)
                             * local_78;
                    fVar33 = ((float)local_68._0_4_ + fVar33 +
                             (1.0 - auVar36._4_4_ * fVar33) * fVar33) * fStack_74;
                    fVar34 = local_c8 * (float)local_e8 * local_78;
                    fVar35 = local_d8 * local_e8._4_4_ * fStack_74;
                    fVar30 = fVar29 - fVar34;
                    fVar32 = fVar33 - fVar35;
                    fVar34 = fVar34 + fVar29;
                    fVar35 = fVar35 + fVar33;
                    in_XMM1 = CONCAT88(CONCAT44(fVar35,fVar34),CONCAT44(fVar32,fVar30));
                    this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                              (local_1c8.
                               super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_f0);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_b8 = in_XMM1;
                    local_a8 = iVar25;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                      _M_realloc_insert<ncnn::BBoxRect_const&>
                                (this_00,__position,(BBoxRect *)local_b8);
                    }
                    else {
                      (__position._M_current)->label = iVar25;
                      (__position._M_current)->xmin = fVar30;
                      (__position._M_current)->ymin = fVar32;
                      (__position._M_current)->xmax = fVar34;
                      (__position._M_current)->ymax = fVar35;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
                    }
                    this_01 = (vector<float,std::allocator<float>> *)
                              (local_1e8.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar26);
                    __position_00._M_current = *(float **)(this_01 + 8);
                    if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
                      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                                (this_01,__position_00,&local_19c);
                    }
                    else {
                      *__position_00._M_current = local_19c;
                      *(float **)(this_01 + 8) = __position_00._M_current + 1;
                    }
                  }
                  pfVar14 = local_80 + 1;
                  pfVar24 = pfVar24 + 1;
                  pfVar18 = pfVar18 + 1;
                  pfVar27 = pfVar27 + 1;
                  pfVar22 = local_138 + 1;
                  uVar19 = uVar19 + 1;
                  lVar28 = lVar28 + 4;
                } while (uVar19 != local_88);
              }
              local_1ec = local_1ec + 1;
            } while (local_1ec != local_108);
          }
          pMVar23 = local_98;
          lVar28 = local_f0;
          this = local_1a8;
          piVar11 = (int *)CONCAT44(local_198.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    local_198.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            if (*piVar11 == 0) {
              if (local_178 == (Allocator *)0x0) {
                if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  free(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start);
                }
              }
              else {
                (*local_178->_vptr_Allocator[3])();
              }
            }
          }
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          iStack_180 = 0;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = 0;
          local_170 = 0;
          uStack_168 = 0;
          local_160 = 0;
          lVar28 = lVar28 + 1;
        } while (lVar28 < this->num_box);
      }
      if (0 < this->num_box) {
        lVar28 = 8;
        lVar26 = 0;
        do {
          pvVar12 = local_1e8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                    ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_158,
                     local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_1c8.
                             super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar28 + -8),
                     *(undefined8 *)
                      ((long)&((local_1c8.
                                super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar28));
          std::vector<float,std::allocator<float>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                    ((vector<float,std::allocator<float>> *)&local_128,
                     local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,*(undefined8 *)((long)pvVar12 + lVar28 + -8),
                     *(undefined8 *)
                      ((long)&(pvVar12->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar28));
          lVar26 = lVar26 + 1;
          lVar28 = lVar28 + 0x18;
        } while (lVar26 < this->num_box);
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_1e8);
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::~vector(&local_1c8);
      uVar19 = local_a0 + 1;
      pMVar23 = (local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar19 < (ulong)((long)(local_100->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar23 >> 6))
    ;
  }
  if ((local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    qsort_descent_inplace<ncnn::BBoxRect>
              (&local_158,&local_128,0,
               (int)((ulong)((long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
  }
  local_1c8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8 = (YoloDetectionOutput *)CONCAT44(local_1a8._4_4_,this->nms_threshold);
  uVar21 = (int)((long)local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x33333333;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_198,(long)(int)uVar21,(allocator_type *)&local_1e8);
  if ((int)uVar21 < 1) {
    local_1e8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_1e8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  }
  else {
    pfVar14 = &(local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start)->xmax;
    uVar19 = 0;
    do {
      uVar4 = ((BBoxRect *)(pfVar14 + -2))->xmin;
      uVar5 = ((BBoxRect *)(pfVar14 + -2))->ymin;
      local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar19] =
           ((float)((ulong)*(undefined8 *)pfVar14 >> 0x20) - (float)uVar5) *
           ((float)*(undefined8 *)pfVar14 - (float)uVar4);
      uVar19 = uVar19 + 1;
      pfVar14 = pfVar14 + 5;
    } while ((uVar21 & 0x7fffffff) != uVar19);
    local_1e8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_1e8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    if (0 < (int)uVar21) {
      iVar25 = 0;
      do {
        uVar17 = (uint)((ulong)((long)local_1c8.
                                      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1c8.
                                     super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2);
        if ((int)uVar17 < 1) {
LAB_0016c487:
          if (local_1c8.
              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_1c8.
              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_1c8,
                       (iterator)
                       local_1c8.
                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(int *)&local_1e8);
          }
          else {
            *(int *)local_1c8.
                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar25;
            local_1c8.
            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)((long)local_1c8.
                                 super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 4);
          }
        }
        else {
          pBVar1 = local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                   _M_impl.super__Vector_impl_data._M_start + iVar25;
          fVar29 = pBVar1->xmin;
          bVar9 = true;
          uVar19 = 0;
          do {
            iVar6 = *(int *)((long)&((local_1c8.
                                      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar19 * 4);
            fVar33 = local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar6].xmax;
            fVar30 = 0.0;
            if (fVar29 <= fVar33) {
              pBVar2 = local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar6;
              fVar32 = pBVar1->xmax;
              fVar34 = pBVar2->xmin;
              if (fVar34 <= fVar32) {
                fVar35 = pBVar1->ymin;
                fVar37 = pBVar2->ymax;
                if (fVar35 <= fVar37) {
                  fVar3 = pBVar1->ymax;
                  fVar38 = pBVar2->ymin;
                  if (fVar38 <= fVar3) {
                    if (fVar32 <= fVar33) {
                      fVar33 = fVar32;
                    }
                    if (fVar34 <= fVar29) {
                      fVar34 = fVar29;
                    }
                    if (fVar3 <= fVar37) {
                      fVar37 = fVar3;
                    }
                    if (fVar38 <= fVar35) {
                      fVar38 = fVar35;
                    }
                    fVar30 = (fVar37 - fVar38) * (fVar33 - fVar34);
                  }
                }
              }
            }
            if (local_1a8._0_4_ <
                fVar30 / ((local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar25] - fVar30) +
                         local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar6])) {
              bVar9 = false;
            }
            uVar19 = uVar19 + 1;
          } while ((uVar17 & 0x7fffffff) != uVar19);
          if (bVar9) goto LAB_0016c487;
        }
        iVar25 = (int)local_1e8.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
        local_1e8.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_1e8.
                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar25);
      } while (iVar25 < (int)uVar21);
    }
  }
  if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar25 = 0;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < (int)((ulong)((long)local_1c8.
                              super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1c8.
                             super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
    lVar28 = 0;
    local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = &((BBoxRect *)0x0)->xmin;
    do {
      iVar6 = *(int *)((long)&((local_1c8.
                                super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar28 * 4);
      __args = local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
               .super__Vector_impl_data._M_start + iVar6;
      if ((BBoxRect *)
          local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (BBoxRect *)
          CONCAT44(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_,
                   local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._0_4_)) {
        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
        _M_realloc_insert<ncnn::BBoxRect_const&>
                  ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_198,
                   (iterator)
                   local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        ((BBoxRect *)
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)->label = __args->label;
        fVar29 = __args->ymin;
        fVar33 = __args->xmax;
        fVar30 = __args->ymax;
        ((BBoxRect *)
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)->xmin = __args->xmin;
        ((BBoxRect *)
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)->ymin = fVar29;
        ((BBoxRect *)
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)->xmax = fVar33;
        ((BBoxRect *)
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)->ymax = fVar30;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 0x14);
      }
      if (local_1e8.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1e8.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_1e8,
                   (iterator)
                   local_1e8.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar6);
      }
      else {
        *(float *)local_1e8.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
             local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[iVar6];
        local_1e8.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1e8.
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4);
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 < (int)((ulong)((long)local_1c8.
                                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_1c8.
                                         super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  uVar21 = (int)((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) * -0x33333333;
  if (uVar21 != 0) {
    this_02 = (local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_02,6,uVar21,4,local_f8->blob_allocator);
    iVar25 = -100;
    if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
       (iVar25 = 0, 0 < (int)uVar21)) {
      iVar6 = this_02->w;
      sVar7 = this_02->elemsize;
      pfVar14 = (float *)((long)this_02->data + 0x14);
      pfVar16 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + 4;
      iVar25 = 0;
      uVar19 = 0;
      do {
        fVar29 = *(float *)((long)&((local_1e8.
                                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                   super__Vector_impl_data._M_start + uVar19 * 4);
        pfVar14[-5] = (float)((int)*pfVar16 + 1);
        pfVar14[-4] = fVar29;
        pfVar14[-3] = pfVar16[-4];
        pfVar14[-2] = pfVar16[-3];
        pfVar14[-1] = pfVar16[-2];
        *pfVar14 = pfVar16[-1];
        uVar19 = uVar19 + 1;
        pfVar14 = (float *)((long)pfVar14 + (long)iVar6 * sVar7);
        pfVar16 = pfVar16 + 5;
      } while ((uVar21 & 0x7fffffff) != uVar19);
    }
  }
  if (local_1e8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.
      super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0016c703:
  if (local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar25;
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b=0; b<bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector< std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector< std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp*2];
            const float bias_h = biases[pp*2+1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p+1);
            const float* wptr = bottom_top_blob.channel(p+2);
            const float* hptr = bottom_top_blob.channel(p+3);

            const float* box_score_ptr = bottom_top_blob.channel(p+4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p+5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = exp(wptr[0]) * bias_w / w;
                    float bbox_h = exp(hptr[0]) * bias_h / h;

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

    //                 fprintf(stderr, "%d %f %f\n", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = { bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index };
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<int> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 0; i < (int)picked.size(); i++)
    {
        int z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = bbox_rects.size();
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1;// +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}